

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> * __thiscall
capnp::anon_unknown_0::MembraneHook::whenMoreResolved
          (Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *__return_storage_ptr__,
          MembraneHook *this)

{
  ClientHook *pCVar1;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *other;
  Promise<kj::Own<capnp::ClientHook>_> *pPVar2;
  MembranePolicy *pMVar3;
  NullableValue<kj::Promise<void>_> *other_00;
  Promise<void> *pPVar4;
  Type *func;
  MembraneHook *local_f0;
  Promise<kj::Own<capnp::ClientHook>_> local_e8;
  PropagateException local_d1;
  Promise<void> local_d0;
  Promise<kj::Own<capnp::ClientHook>_> local_c0;
  Maybe<kj::Promise<void>_> local_b0;
  undefined1 local_98 [8];
  NullableValue<kj::Promise<void>_> r_1;
  undefined1 local_68 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> promise;
  FixVoid<kj::Own<capnp::ClientHook>_> local_40;
  Promise<kj::Own<capnp::ClientHook>_> local_30;
  Own<capnp::ClientHook> *local_20;
  Own<capnp::ClientHook> *r;
  MembraneHook *this_local;
  
  r = (Own<capnp::ClientHook> *)this;
  this_local = (MembraneHook *)__return_storage_ptr__;
  local_20 = kj::_::readMaybe<capnp::ClientHook>(&this->resolved);
  if (local_20 == (Own<capnp::ClientHook> *)0x0) {
    pCVar1 = kj::Own<capnp::ClientHook>::operator->(&this->inner);
    (*pCVar1->_vptr_ClientHook[3])();
    other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook>>>
                      ((Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)
                       &r_1.field_1.value.super_PromiseBase.node.ptr);
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_68,other);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)
               &r_1.field_1.value.super_PromiseBase.node.ptr);
    pPVar2 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_68);
    if (pPVar2 == (Promise<kj::Own<capnp::ClientHook>_> *)0x0) {
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::Maybe
                (__return_storage_ptr__,(void *)0x0);
    }
    else {
      pMVar3 = kj::Own<capnp::MembranePolicy>::operator->(&this->policy);
      (*pMVar3->_vptr_MembranePolicy[3])(&local_b0);
      other_00 = kj::_::readMaybe<kj::Promise<void>>(&local_b0);
      kj::_::NullableValue<kj::Promise<void>_>::NullableValue
                ((NullableValue<kj::Promise<void>_> *)local_98,other_00);
      kj::Maybe<kj::Promise<void>_>::~Maybe(&local_b0);
      pPVar4 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_98);
      if (pPVar4 != (Promise<void> *)0x0) {
        pPVar2 = kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::operator->
                           ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_68);
        func = (Type *)kj::_::NullableValue<kj::Promise<void>_>::operator->
                                 ((NullableValue<kj::Promise<void>_> *)local_98);
        kj::Promise<void>::
        then<capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::_lambda()_1_,kj::_::PropagateException>
                  (&local_d0,func,&local_d1);
        kj::Promise<kj::Own<capnp::ClientHook>_>::exclusiveJoin(&local_c0,pPVar2);
        pPVar2 = kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::operator*
                           ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_68);
        kj::Promise<kj::Own<capnp::ClientHook>_>::operator=(pPVar2,&local_c0);
        kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise(&local_c0);
        kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
                  ((Promise<kj::Own<capnp::ClientHook>_> *)&local_d0);
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
                ((NullableValue<kj::Promise<void>_> *)local_98);
      pPVar2 = kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::operator->
                         ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_68);
      local_f0 = this;
      kj::Promise<kj::Own<capnp::ClientHook>>::
      then<capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook>&&)_1_,kj::_::PropagateException>
                ((Promise<kj::Own<capnp::ClientHook>> *)&local_e8,(Type *)pPVar2,
                 (PropagateException *)&local_f0);
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::Maybe(__return_storage_ptr__,&local_e8);
      kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise(&local_e8);
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_68);
  }
  else {
    pCVar1 = kj::Own<capnp::ClientHook>::get(local_20);
    (*pCVar1->_vptr_ClientHook[4])();
    kj::Promise<kj::Own<capnp::ClientHook>_>::Promise(&local_30,&local_40);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::Maybe(__return_storage_ptr__,&local_30);
    kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise(&local_30);
    kj::Own<capnp::ClientHook>::~Own(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_MAYBE(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->get()->addRef());
    }

    KJ_IF_MAYBE(promise, inner->whenMoreResolved()) {
      KJ_IF_MAYBE(r, policy->onRevoked()) {
        *promise = promise->exclusiveJoin(r->then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise->then([this](kj::Own<ClientHook>&& newInner) {
        kj::Own<ClientHook> newResolved = wrap(*newInner, *policy, reverse);
        if (resolved == nullptr) {
          resolved = newResolved->addRef();
        }
        return newResolved;
      });
    }